

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

void __thiscall filesystem::path::set(path *this,string *str,path_type type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  int in_EDX;
  string *in_RSI;
  int *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenized;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  bool bVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd60;
  allocator<char> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd90;
  const_iterator in_stack_fffffffffffffd98;
  string *local_240;
  bool local_1a1;
  undefined1 local_189 [57];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  undefined1 local_121 [57];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  string *local_d8;
  string local_d0 [32];
  string *local_b0;
  undefined8 local_a8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  allocator<char> local_39;
  string local_38 [40];
  string *local_10;
  
  *in_RDI = in_EDX;
  if (in_EDX != 0) {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_189;
    local_10 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    tokenize(in_stack_fffffffffffffd98._M_current,in_stack_fffffffffffffd90._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_RSI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    std::__cxx11::string::~string((string *)(local_189 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_189);
    uVar2 = std::__cxx11::string::empty();
    bVar7 = false;
    if ((uVar2 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
      bVar7 = *pcVar5 == '/';
    }
    *(bool *)(in_RDI + 8) = bVar7;
    return;
  }
  std::__cxx11::string::string(local_38,in_RSI);
  if ((set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&set(std::__cxx11::string_const&,filesystem::path::path_type)::
                                   LONG_PATH_PREFIX_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::allocator<char>::~allocator(&local_39);
    __cxa_atexit(std::__cxx11::string::~string,
                 &set(std::__cxx11::string_const&,filesystem::path::path_type)::
                  LONG_PATH_PREFIX_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&set(std::__cxx11::string_const&,filesystem::path::path_type)::
                         LONG_PATH_PREFIX_abi_cxx11_);
  }
  uVar3 = std::__cxx11::string::length();
  uVar4 = std::__cxx11::string::length();
  local_1a1 = false;
  if (uVar4 <= uVar3) {
    local_68 = (char *)std::begin<std::__cxx11::string>(in_stack_fffffffffffffd38);
    local_70 = (char *)std::end<std::__cxx11::string>(in_stack_fffffffffffffd38);
    local_78 = (char *)std::begin<std::__cxx11::string>(in_stack_fffffffffffffd38);
    local_60 = std::
               mismatch<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50);
    local_80 = (char *)std::end<std::__cxx11::string>(in_stack_fffffffffffffd38);
    local_1a1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffd38);
  }
  if (local_1a1 != false) {
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)local_38,0);
  }
  uVar3 = std::__cxx11::string::length();
  if (1 < uVar3) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar5 == '\\') {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar5 == '\\') {
        std::
        initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::initializer_list(&local_90);
        __l._M_len = (size_type)in_stack_fffffffffffffd60._M_current;
        __l._M_array = (iterator)in_stack_fffffffffffffd58._M_current;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd50._M_current,__l);
        std::__cxx11::string::erase((ulong)local_38,0);
        lVar6 = std::__cxx11::string::find_first_of((char *)local_38,0x952404);
        if (lVar6 == -1) {
          *(undefined1 *)((long)in_RDI + 0x21) = 0;
          *(undefined1 *)(in_RDI + 8) = 0;
        }
        else {
          *(undefined1 *)((long)in_RDI + 0x21) = 1;
          *(undefined1 *)(in_RDI + 8) = 1;
        }
        goto LAB_00547a27;
      }
    }
  }
  uVar3 = std::__cxx11::string::length();
  if (3 < uVar3) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar5 == 'U') {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar5 == 'N') {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if (*pcVar5 == 'C') {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
          if (*pcVar5 == '\\') {
            std::
            initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::initializer_list(&local_a0);
            __l_00._M_len = (size_type)in_stack_fffffffffffffd60._M_current;
            __l_00._M_array = (iterator)in_stack_fffffffffffffd58._M_current;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd50._M_current,__l_00);
            std::__cxx11::string::erase((ulong)local_38,0);
            *(undefined1 *)(in_RDI + 8) = 1;
            *(undefined1 *)((long)in_RDI + 0x21) = 1;
            goto LAB_00547a27;
          }
        }
      }
    }
  }
  uVar3 = std::__cxx11::string::length();
  if (2 < uVar3) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    iVar1 = isalpha((int)*pcVar5);
    if (iVar1 != 0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar5 == ':') {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if (*pcVar5 != '\\') {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
          if (*pcVar5 != '/') goto LAB_005479e3;
        }
        local_d8 = local_d0;
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_38);
        local_b0 = local_d0;
        local_a8 = 1;
        __l_01._M_len = (size_type)in_stack_fffffffffffffd60._M_current;
        __l_01._M_array = (iterator)in_stack_fffffffffffffd58._M_current;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd50._M_current,__l_01);
        local_240 = (string *)&local_b0;
        do {
          local_240 = local_240 + -0x20;
          std::__cxx11::string::~string(local_240);
        } while (local_240 != local_d0);
        std::__cxx11::string::erase((ulong)local_38,0);
        *(undefined1 *)(in_RDI + 8) = 1;
        *(undefined1 *)((long)in_RDI + 0x21) = 0;
        goto LAB_00547a27;
      }
    }
  }
LAB_005479e3:
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_e8);
  __l_02._M_len = (size_type)in_stack_fffffffffffffd60._M_current;
  __l_02._M_array = (iterator)in_stack_fffffffffffffd58._M_current;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd50._M_current,__l_02);
  *(undefined1 *)(in_RDI + 8) = 0;
  *(undefined1 *)((long)in_RDI + 0x21) = 0;
LAB_00547a27:
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  tokenize(in_stack_fffffffffffffd98._M_current,in_stack_fffffffffffffd90._M_current);
  std::__cxx11::string::~string((string *)(local_121 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_121);
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffd38);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffd38);
  local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffd38);
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffd38);
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_01,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                         in_stack_fffffffffffffd88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd50._M_current);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void set(const std::string &str, path_type type = native_path) {
        m_type = type;
        if (type == windows_path) {
            std::string tmp = str;

            // Long windows paths (sometimes) begin with the prefix \\?\. It should only
            // be used when the path is >MAX_PATH characters long, so we remove it
            // for convenience and add it back (if necessary) in str()/wstr().
            static const std::string LONG_PATH_PREFIX = "\\\\?\\";
            if (tmp.length() >= LONG_PATH_PREFIX.length()
             && std::mismatch(std::begin(LONG_PATH_PREFIX), std::end(LONG_PATH_PREFIX), std::begin(tmp)).first == std::end(LONG_PATH_PREFIX)) {
                tmp.erase(0, LONG_PATH_PREFIX.length());
            }

            // Special-case handling of absolute SMB paths, which start with the prefix "\\".
            if (tmp.length() >= 2 && tmp[0] == '\\' && tmp[1] == '\\') {
                m_path = {};
                tmp.erase(0, 2);

                // Interestingly, there is a special-special case where relative paths may be specified as beginning with a "\\"
                // when a non-SMB file with a more-than-260-characters-long absolute _local_ path is double-clicked. This seems to
                // only happen with single-segment relative paths, so we can check for this condition by making sure no further
                // path separators are present.
                if (tmp.find_first_of("/\\") != std::string::npos)
                    m_absolute = m_smb = true;
                else
                    m_absolute = m_smb = false;

            // Special-case handling of absolute SMB paths, which start with the prefix "UNC\"
            } else if (tmp.length() >= 4 && tmp[0] == 'U' && tmp[1] == 'N' && tmp[2] == 'C' && tmp[3] == '\\') {
                m_path = {};
                tmp.erase(0, 4);
                m_absolute = true;
                m_smb = true;
            // Special-case handling of absolute local paths, which start with the drive letter and a colon "X:\"
            } else if (tmp.length() >= 3 && std::isalpha(tmp[0]) && tmp[1] == ':' && (tmp[2] == '\\' || tmp[2] == '/')) {
                m_path = {tmp.substr(0, 2)};
                tmp.erase(0, 3);
                m_absolute = true;
                m_smb = false;
            // Relative path
            } else {
                m_path = {};
                m_absolute = false;
                m_smb = false;
            }

            std::vector<std::string> tokenized = tokenize(tmp, "/\\");
            m_path.insert(std::end(m_path), std::begin(tokenized), std::end(tokenized));
        } else {
            m_path = tokenize(str, "/");
            m_absolute = !str.empty() && str[0] == '/';
        }
    }